

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::rec_delete
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Siblings *sib)

{
  pointer ppVar1;
  
  if ((sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size != 0) {
    ppVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    do {
      if (((ppVar1->second).children_)->parent_ == ppVar1->first) {
        rec_delete(this,(ppVar1->second).children_);
      }
      ppVar1 = ppVar1 + 1;
    } while (ppVar1 != (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                       (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
  }
  boost::container::
  vector<boost::container::dtl::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_>,_void>
  ::~vector((vector<boost::container::dtl::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_>,_void>
             *)&sib->members_);
  operator_delete(sib,0x28);
  return;
}

Assistant:

void rec_delete(Siblings * sib) {
    for (auto sh = sib->members().begin(); sh != sib->members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    delete sib;
  }